

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O1

void test_dt_unsignedInt(void)

{
  char cVar1;
  char cVar2;
  XSValue *pXVar3;
  wchar16 *pwVar4;
  char *pcVar5;
  long lVar6;
  void *pvVar7;
  char *pcVar8;
  int iVar9;
  bool bVar10;
  Status myStatus;
  char lex_v_ran_iv_2 [3];
  char lex_v_ran_v_2 [2];
  Status myStatus_14;
  char lex_v_ran_v_2_canrep [2];
  char lex_v_ran_iv_2_canrep [3];
  char lex_v_ran_iv_1 [11];
  char lex_iv_2 [8];
  char lex_iv_1 [10];
  char data_canrep_2 [6];
  char data_canrep_1 [6];
  char lex_v_ran_v_1 [12];
  char data_rawstr_2 [9];
  char lex_v_ran_v_1_canrep [11];
  char lex_v_ran_iv_1_canrep [11];
  char data_rawstr_1 [14];
  char lex_v_ran_v_0 [12];
  StrX local_f8;
  char *local_e8;
  char local_da [4];
  char local_d6 [2];
  Status local_d4;
  char local_ce [2];
  undefined2 local_cc;
  undefined1 local_ca;
  char local_c8 [16];
  char local_b8 [8];
  undefined8 local_b0;
  undefined2 local_a8;
  char local_a0 [8];
  char local_98 [8];
  char local_90 [12];
  int local_84;
  char local_80 [16];
  char local_70 [16];
  char local_60 [16];
  char local_50 [16];
  char local_40 [16];
  
  builtin_strncpy(local_40,"   1234   \n",0xc);
  builtin_strncpy(local_90 + 8,"295",4);
  builtin_strncpy(local_90,"+4294967",8);
  local_d6[0] = '0';
  local_d6[1] = '\0';
  builtin_strncpy(local_c8,"4294967296",0xb);
  local_da[2] = 0;
  local_da[0] = '-';
  local_da[1] = '1';
  builtin_strncpy(local_70,"4294967295",0xb);
  local_ce[0] = '0';
  local_ce[1] = '\0';
  builtin_strncpy(local_60,"4294967296",0xb);
  local_ca = 0;
  local_cc = 0x312d;
  local_b0 = 0x35342e3433623231;
  local_a8 = 0x36;
  builtin_strncpy(local_b8,"1234b56",8);
  builtin_strncpy(local_50 + 8,"5   \n",6);
  builtin_strncpy(local_50,"   +1234",8);
  builtin_strncpy(local_98,"12345",6);
  builtin_strncpy(local_80,"00012345",9);
  builtin_strncpy(local_a0,"12345",6);
  local_e8 = (char *)((ulong)local_e8 & 0xffffffff00000000);
  local_f8.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_40,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_f8.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_40,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_f8.fUnicodeForm,dt_unsignedInt,(Status *)&local_e8,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_f8);
  if (cVar2 == '\0') {
    StrX::StrX(&local_f8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xa73,local_40,local_f8.fLocalForm,1);
    StrX::~StrX(&local_f8);
    errSeen = 1;
  }
  local_e8 = (char *)((ulong)local_e8 & 0xffffffff00000000);
  local_f8.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_90,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_f8.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_90,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_f8.fUnicodeForm,dt_unsignedInt,(Status *)&local_e8,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_f8);
  if (cVar2 == '\0') {
    StrX::StrX(&local_f8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xa74,local_90,local_f8.fLocalForm,1);
    StrX::~StrX(&local_f8);
    errSeen = 1;
  }
  local_e8 = (char *)((ulong)local_e8 & 0xffffffff00000000);
  local_f8.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_d6,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_f8.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_d6,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_f8.fUnicodeForm,dt_unsignedInt,(Status *)&local_e8,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_f8);
  if (cVar2 == '\0') {
    StrX::StrX(&local_f8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xa75,local_d6,local_f8.fLocalForm,1);
    StrX::~StrX(&local_f8);
    errSeen = 1;
  }
  local_e8 = (char *)((ulong)local_e8 & 0xffffffff00000000);
  local_f8.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_f8.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_f8.fUnicodeForm,dt_unsignedInt,(Status *)&local_e8,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_f8);
  if (cVar2 == '\0') {
    if ((int)local_e8 != 6) {
      StrX::StrX(&local_f8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
      if (((ulong)local_e8 & 0xffffffff) < 0xb) {
        pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_e8 & 0xffffffff];
      }
      else {
        pcVar8 = "st_UnknownType";
      }
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xa78,local_c8,local_f8.fLocalForm,"st_FOCA0002",pcVar8);
      goto LAB_001182cf;
    }
  }
  else {
    StrX::StrX(&local_f8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xa78,local_c8,local_f8.fLocalForm,0);
LAB_001182cf:
    StrX::~StrX(&local_f8);
    errSeen = 1;
  }
  local_e8 = (char *)((ulong)local_e8 & 0xffffffff00000000);
  local_f8.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_da,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_f8.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_da,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_f8.fUnicodeForm,dt_unsignedInt,(Status *)&local_e8,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_f8);
  if (cVar2 == '\0') {
    if ((int)local_e8 != 6) {
      StrX::StrX(&local_f8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
      if (((ulong)local_e8 & 0xffffffff) < 0xb) {
        pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_e8 & 0xffffffff];
      }
      else {
        pcVar8 = "st_UnknownType";
      }
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xa79,local_da,local_f8.fLocalForm,"st_FOCA0002",pcVar8);
      goto LAB_001183c3;
    }
  }
  else {
    StrX::StrX(&local_f8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xa79,local_da,local_f8.fLocalForm,0);
LAB_001183c3:
    StrX::~StrX(&local_f8);
    errSeen = 1;
  }
  local_e8 = (char *)((ulong)local_e8 & 0xffffffff00000000);
  local_f8.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         ((char *)&local_b0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_f8.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ((char *)&local_b0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_f8.fUnicodeForm,dt_unsignedInt,(Status *)&local_e8,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_f8);
  if (cVar2 == '\0') {
    if ((int)local_e8 != 6) {
      StrX::StrX(&local_f8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
      if (((ulong)local_e8 & 0xffffffff) < 0xb) {
        pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_e8 & 0xffffffff];
      }
      else {
        pcVar8 = "st_UnknownType";
      }
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xa7c,&local_b0,local_f8.fLocalForm,"st_FOCA0002",pcVar8);
      goto LAB_001184b7;
    }
  }
  else {
    StrX::StrX(&local_f8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xa7c,&local_b0,local_f8.fLocalForm,0);
LAB_001184b7:
    StrX::~StrX(&local_f8);
    errSeen = 1;
  }
  local_e8 = (char *)((ulong)local_e8 & 0xffffffff00000000);
  local_f8.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_b8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_f8.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_b8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_f8.fUnicodeForm,dt_unsignedInt,(Status *)&local_e8,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_f8);
  if (cVar2 == '\0') {
    if ((int)local_e8 != 6) {
      StrX::StrX(&local_f8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
      if (((ulong)local_e8 & 0xffffffff) < 0xb) {
        pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_e8 & 0xffffffff];
      }
      else {
        pcVar8 = "st_UnknownType";
      }
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xa7d,local_b8,local_f8.fLocalForm,"st_FOCA0002",pcVar8);
      goto LAB_001185ab;
    }
  }
  else {
    StrX::StrX(&local_f8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xa7d,local_b8,local_f8.fLocalForm,0);
LAB_001185ab:
    StrX::~StrX(&local_f8);
    errSeen = 1;
  }
  iVar9 = 1;
  do {
    local_e8 = (char *)((ulong)local_e8 & 0xffffffff00000000);
    local_84 = iVar9;
    local_f8.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_40,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_f8.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_40,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_f8.fUnicodeForm,dt_unsignedInt,(Status *)&local_e8,ver_10,iVar9 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_f8);
    if (pXVar3 == (XSValue *)0x0) {
      StrX::StrX(&local_f8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xa9a,local_40);
      StrX::~StrX(&local_f8);
      errSeen = 1;
    }
    else {
      pvVar7 = (void *)(ulong)*(uint *)(pXVar3 + 8);
      if (*(uint *)(pXVar3 + 8) != 0x4d2) {
        printf("ACTVALUE_TEST Unexpected dt_unsignedIntXSValue, got %d expected %d\n",pvVar7,0x4d2);
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar7);
    }
    iVar9 = local_84;
    bVar10 = local_84 == 1;
    local_e8 = (char *)((ulong)local_e8 & 0xffffffff00000000);
    local_f8.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_90,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_f8.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_90,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_f8.fUnicodeForm,dt_unsignedInt,(Status *)&local_e8,ver_10,bVar10,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_f8);
    if (pXVar3 == (XSValue *)0x0) {
      StrX::StrX(&local_f8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xa9c,local_90);
      StrX::~StrX(&local_f8);
      errSeen = 1;
    }
    else {
      pvVar7 = (void *)(ulong)*(uint *)(pXVar3 + 8);
      if (*(uint *)(pXVar3 + 8) != 0xffffffff) {
        printf("ACTVALUE_TEST Unexpected dt_unsignedIntXSValue, got %d expected %d\n",pvVar7,
               0xffffffff);
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar7);
    }
    local_e8 = (char *)((ulong)local_e8 & 0xffffffff00000000);
    local_f8.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_d6,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_f8.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_d6,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_f8.fUnicodeForm,dt_unsignedInt,(Status *)&local_e8,ver_10,iVar9 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_f8);
    if (pXVar3 == (XSValue *)0x0) {
      StrX::StrX(&local_f8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xa9d,local_d6);
      StrX::~StrX(&local_f8);
      errSeen = 1;
    }
    else {
      pvVar7 = (void *)(ulong)*(uint *)(pXVar3 + 8);
      if (*(uint *)(pXVar3 + 8) != 0) {
        printf("ACTVALUE_TEST Unexpected dt_unsignedIntXSValue, got %d expected %d\n",pvVar7,0);
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar7);
    }
    local_e8 = (char *)((ulong)local_e8 & 0xffffffff00000000);
    local_f8.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_f8.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_f8.fUnicodeForm,dt_unsignedInt,(Status *)&local_e8,ver_10,iVar9 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_f8);
    if (pXVar3 == (XSValue *)0x0) {
      if ((int)local_e8 != 6) {
        StrX::StrX(&local_f8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
        pcVar8 = "st_UnknownType";
        if (((ulong)local_e8 & 0xffffffff) < 0xb) {
          pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_e8 & 0xffffffff];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xa9e,local_c8,local_f8.fLocalForm,"st_FOCA0002",pcVar8);
        StrX::~StrX(&local_f8);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_f8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
      pvVar7 = (void *)0xa9e;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xa9e,local_c8);
      StrX::~StrX(&local_f8);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar7);
    }
    local_e8 = (char *)((ulong)local_e8 & 0xffffffff00000000);
    local_f8.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_da,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_f8.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_da,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_f8.fUnicodeForm,dt_unsignedInt,(Status *)&local_e8,ver_10,iVar9 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_f8);
    if (pXVar3 == (XSValue *)0x0) {
      if ((int)local_e8 != 6) {
        StrX::StrX(&local_f8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
        pcVar8 = "st_UnknownType";
        if (((ulong)local_e8 & 0xffffffff) < 0xb) {
          pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_e8 & 0xffffffff];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xa9f,local_da,local_f8.fLocalForm,"st_FOCA0002",pcVar8);
        StrX::~StrX(&local_f8);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_f8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
      pvVar7 = (void *)0xa9f;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xa9f,local_da);
      StrX::~StrX(&local_f8);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar7);
    }
    local_e8 = (char *)((ulong)local_e8 & 0xffffffff00000000);
    local_f8.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           ((char *)&local_b0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_f8.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ((char *)&local_b0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_f8.fUnicodeForm,dt_unsignedInt,(Status *)&local_e8,ver_10,iVar9 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_f8);
    if (pXVar3 == (XSValue *)0x0) {
      if ((int)local_e8 != 6) {
        StrX::StrX(&local_f8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
        pcVar8 = "st_UnknownType";
        if (((ulong)local_e8 & 0xffffffff) < 0xb) {
          pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_e8 & 0xffffffff];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xaa1,&local_b0,local_f8.fLocalForm,"st_FOCA0002",pcVar8);
        StrX::~StrX(&local_f8);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_f8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
      pvVar7 = (void *)0xaa1;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xaa1,&local_b0);
      StrX::~StrX(&local_f8);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar7);
    }
    local_e8 = (char *)((ulong)local_e8 & 0xffffffff00000000);
    local_f8.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_b8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_f8.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_b8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar3 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_f8.fUnicodeForm,dt_unsignedInt,(Status *)&local_e8,ver_10,iVar9 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_f8);
    if (pXVar3 == (XSValue *)0x0) {
      if ((int)local_e8 != 6) {
        StrX::StrX(&local_f8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
        pcVar8 = "st_UnknownType";
        if (((ulong)local_e8 & 0xffffffff) < 0xb) {
          pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_e8 & 0xffffffff];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xaa2,local_b8,local_f8.fLocalForm,"st_FOCA0002",pcVar8);
        StrX::~StrX(&local_f8);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_f8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
      pvVar7 = (void *)0xaa2;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xaa2,local_b8);
      StrX::~StrX(&local_f8);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar7);
    }
    iVar9 = iVar9 + -1;
  } while (iVar9 == 0);
  iVar9 = 0;
  do {
    local_d4 = st_Init;
    local_f8.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_50,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_f8.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_50,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar4 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_f8.fUnicodeForm,dt_unsignedInt,&local_d4,ver_10,iVar9 == 0,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_f8);
    if (pwVar4 == (wchar16 *)0x0) {
      StrX::StrX(&local_f8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xac0,local_50);
      StrX::~StrX(&local_f8);
      errSeen = 1;
    }
    else {
      local_e8 = (char *)xercesc_4_0::XMLString::transcode
                                   (pwVar4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar8 = local_98;
      if (local_e8 != pcVar8) {
        pcVar5 = local_e8;
        if (local_e8 == (char *)0x0) {
LAB_00118d9d:
          if (*pcVar8 == '\0') goto LAB_00118dea;
        }
        else {
          do {
            cVar2 = *pcVar5;
            if (cVar2 == '\0') goto LAB_00118d9d;
            pcVar5 = pcVar5 + 1;
            cVar1 = *pcVar8;
            pcVar8 = pcVar8 + 1;
          } while (cVar2 == cVar1);
        }
        StrX::StrX(&local_f8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xac0,local_50,local_f8.fLocalForm,local_e8,local_98);
        StrX::~StrX(&local_f8);
        errSeen = 1;
      }
LAB_00118dea:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar4);
      xercesc_4_0::XMLString::release(&local_e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_d4 = st_Init;
    local_f8.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_80,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_f8.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_80,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar4 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_f8.fUnicodeForm,dt_unsignedInt,&local_d4,ver_10,iVar9 == 0,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_f8);
    if (pwVar4 == (wchar16 *)0x0) {
      StrX::StrX(&local_f8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xac1,local_80);
      StrX::~StrX(&local_f8);
      errSeen = 1;
    }
    else {
      local_e8 = (char *)xercesc_4_0::XMLString::transcode
                                   (pwVar4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar8 = local_a0;
      if (local_e8 != pcVar8) {
        pcVar5 = local_e8;
        if (local_e8 == (char *)0x0) {
LAB_00118ee1:
          if (*pcVar8 == '\0') goto LAB_00118f2b;
        }
        else {
          do {
            cVar2 = *pcVar5;
            if (cVar2 == '\0') goto LAB_00118ee1;
            pcVar5 = pcVar5 + 1;
            cVar1 = *pcVar8;
            pcVar8 = pcVar8 + 1;
          } while (cVar2 == cVar1);
        }
        StrX::StrX(&local_f8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xac1,local_80,local_f8.fLocalForm,local_e8,local_a0);
        StrX::~StrX(&local_f8);
        errSeen = 1;
      }
LAB_00118f2b:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar4);
      xercesc_4_0::XMLString::release(&local_e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_d4 = st_Init;
    local_f8.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_90,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_f8.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_90,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar4 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_f8.fUnicodeForm,dt_unsignedInt,&local_d4,ver_10,iVar9 == 0,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_f8);
    if (pwVar4 == (wchar16 *)0x0) {
      StrX::StrX(&local_f8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xac3,local_90);
      StrX::~StrX(&local_f8);
      errSeen = 1;
    }
    else {
      local_e8 = (char *)xercesc_4_0::XMLString::transcode
                                   (pwVar4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar8 = local_70;
      if (local_e8 != pcVar8) {
        pcVar5 = local_e8;
        if (local_e8 == (char *)0x0) {
LAB_00119025:
          if (*pcVar8 == '\0') goto LAB_00119072;
        }
        else {
          do {
            cVar2 = *pcVar5;
            if (cVar2 == '\0') goto LAB_00119025;
            pcVar5 = pcVar5 + 1;
            cVar1 = *pcVar8;
            pcVar8 = pcVar8 + 1;
          } while (cVar2 == cVar1);
        }
        StrX::StrX(&local_f8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xac3,local_90,local_f8.fLocalForm,local_e8,local_70);
        StrX::~StrX(&local_f8);
        errSeen = 1;
      }
LAB_00119072:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar4);
      xercesc_4_0::XMLString::release(&local_e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_d4 = st_Init;
    local_f8.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_d6,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_f8.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_d6,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar4 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_f8.fUnicodeForm,dt_unsignedInt,&local_d4,ver_10,iVar9 == 0,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_f8);
    if (pwVar4 == (wchar16 *)0x0) {
      StrX::StrX(&local_f8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xac4,local_d6);
      StrX::~StrX(&local_f8);
      errSeen = 1;
    }
    else {
      local_e8 = (char *)xercesc_4_0::XMLString::transcode
                                   (pwVar4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar8 = local_ce;
      if (local_e8 != pcVar8) {
        pcVar5 = local_e8;
        if (local_e8 == (char *)0x0) {
LAB_0011916e:
          if (*pcVar8 == '\0') goto LAB_001191b8;
        }
        else {
          do {
            cVar2 = *pcVar5;
            if (cVar2 == '\0') goto LAB_0011916e;
            pcVar5 = pcVar5 + 1;
            cVar1 = *pcVar8;
            pcVar8 = pcVar8 + 1;
          } while (cVar2 == cVar1);
        }
        StrX::StrX(&local_f8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xac4,local_d6,local_f8.fLocalForm,local_e8,local_ce);
        StrX::~StrX(&local_f8);
        errSeen = 1;
      }
LAB_001191b8:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar4);
      xercesc_4_0::XMLString::release(&local_e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_e8 = (char *)((ulong)local_e8 & 0xffffffff00000000);
    local_f8.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           ((char *)&local_b0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_f8.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ((char *)&local_b0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar6 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_f8.fUnicodeForm,dt_unsignedInt,(Status *)&local_e8,ver_10,iVar9 == 0,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_f8);
    if (lVar6 == 0) {
      if ((int)local_e8 != 6) {
        StrX::StrX(&local_f8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
        pcVar8 = "st_UnknownType";
        if (((ulong)local_e8 & 0xffffffff) < 0xb) {
          pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_e8 & 0xffffffff];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0xac6,&local_b0,local_f8.fLocalForm,"st_FOCA0002",pcVar8);
        StrX::~StrX(&local_f8);
        goto LAB_001192d2;
      }
    }
    else {
      StrX::StrX(&local_f8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xac6,&local_b0);
      StrX::~StrX(&local_f8);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar6);
LAB_001192d2:
      errSeen = 1;
    }
    local_e8 = (char *)((ulong)local_e8 & 0xffffffff00000000);
    local_f8.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_b8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_f8.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_b8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar6 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_f8.fUnicodeForm,dt_unsignedInt,(Status *)&local_e8,ver_10,iVar9 == 0,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_f8);
    if (lVar6 == 0) {
      if ((int)local_e8 != 6) {
        StrX::StrX(&local_f8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
        pcVar8 = "st_UnknownType";
        if (((ulong)local_e8 & 0xffffffff) < 0xb) {
          pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_e8 & 0xffffffff];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0xac7,local_b8,local_f8.fLocalForm,"st_FOCA0002",pcVar8);
        StrX::~StrX(&local_f8);
        goto LAB_001193da;
      }
    }
    else {
      StrX::StrX(&local_f8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xac7,local_b8);
      StrX::~StrX(&local_f8);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar6);
LAB_001193da:
      errSeen = 1;
    }
    bVar10 = iVar9 == 0;
    iVar9 = iVar9 + 1;
  } while (bVar10);
  local_e8 = (char *)((ulong)local_e8 & 0xffffffff00000000);
  local_f8.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_f8.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  lVar6 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (local_f8.fUnicodeForm,dt_unsignedInt,(Status *)&local_e8,ver_10,true,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_f8);
  if (lVar6 == 0) {
    if ((int)local_e8 != 6) {
      StrX::StrX(&local_f8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
      if (((ulong)local_e8 & 0xffffffff) < 0xb) {
        pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_e8 & 0xffffffff];
      }
      else {
        pcVar8 = "st_UnknownType";
      }
      printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xacc,local_c8,local_f8.fLocalForm,"st_FOCA0002",pcVar8);
      StrX::~StrX(&local_f8);
      goto LAB_001194f5;
    }
  }
  else {
    StrX::StrX(&local_f8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0xacc,local_c8);
    StrX::~StrX(&local_f8);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar6);
LAB_001194f5:
    errSeen = 1;
  }
  local_e8 = (char *)((ulong)local_e8 & 0xffffffff00000000);
  local_f8.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_da,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_f8.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_da,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  lVar6 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (local_f8.fUnicodeForm,dt_unsignedInt,(Status *)&local_e8,ver_10,true,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_f8);
  if (lVar6 == 0) {
    if ((int)local_e8 != 6) {
      StrX::StrX(&local_f8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
      if (((ulong)local_e8 & 0xffffffff) < 0xb) {
        pcVar8 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_e8 & 0xffffffff];
      }
      else {
        pcVar8 = "st_UnknownType";
      }
      printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xacd,local_da,local_f8.fLocalForm,"st_FOCA0002",pcVar8);
      StrX::~StrX(&local_f8);
      goto LAB_00119600;
    }
  }
  else {
    StrX::StrX(&local_f8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0xacd,local_da);
    StrX::~StrX(&local_f8);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar6);
LAB_00119600:
    errSeen = 1;
  }
  local_d4 = st_Init;
  local_f8.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_f8.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pwVar4 = (wchar16 *)
           xercesc_4_0::XSValue::getCanonicalRepresentation
                     (local_f8.fUnicodeForm,dt_unsignedInt,&local_d4,ver_10,false,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_f8);
  if (pwVar4 == (wchar16 *)0x0) {
    StrX::StrX(&local_f8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
    printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
           ,0xad0,local_c8);
    StrX::~StrX(&local_f8);
    errSeen = 1;
  }
  else {
    local_e8 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar8 = local_60;
    if (local_e8 != pcVar8) {
      pcVar5 = local_e8;
      if (local_e8 == (char *)0x0) {
LAB_001196dd:
        if (*pcVar8 == '\0') goto LAB_0011972c;
      }
      else {
        do {
          cVar2 = *pcVar5;
          if (cVar2 == '\0') goto LAB_001196dd;
          pcVar5 = pcVar5 + 1;
          cVar1 = *pcVar8;
          pcVar8 = pcVar8 + 1;
        } while (cVar2 == cVar1);
      }
      StrX::StrX(&local_f8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
      printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
             ,0xad0,local_c8,local_f8.fLocalForm,local_e8,local_60);
      StrX::~StrX(&local_f8);
      errSeen = 1;
    }
LAB_0011972c:
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar4);
    xercesc_4_0::XMLString::release(&local_e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  local_d4 = st_Init;
  local_f8.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_da,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_f8.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_da,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pwVar4 = (wchar16 *)
           xercesc_4_0::XSValue::getCanonicalRepresentation
                     (local_f8.fUnicodeForm,dt_unsignedInt,&local_d4,ver_10,false,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_f8);
  if (pwVar4 == (wchar16 *)0x0) {
    StrX::StrX(&local_f8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
    printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
           ,0xad1,local_da,local_f8.fLocalForm);
    StrX::~StrX(&local_f8);
    errSeen = 1;
    return;
  }
  local_e8 = (char *)xercesc_4_0::XMLString::transcode
                               (pwVar4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pcVar8 = (char *)&local_cc;
  if (local_e8 != pcVar8) {
    pcVar5 = local_e8;
    if (local_e8 == (char *)0x0) {
LAB_0011981a:
      if (*pcVar8 == '\0') goto LAB_00119866;
    }
    else {
      do {
        cVar2 = *pcVar5;
        if (cVar2 == '\0') goto LAB_0011981a;
        pcVar5 = pcVar5 + 1;
        cVar1 = *pcVar8;
        pcVar8 = pcVar8 + 1;
      } while (cVar2 == cVar1);
    }
    StrX::StrX(&local_f8,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
    printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
           ,0xad1,local_da,local_f8.fLocalForm,local_e8,&local_cc);
    StrX::~StrX(&local_f8);
    errSeen = 1;
  }
LAB_00119866:
  (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
            (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar4);
  xercesc_4_0::XMLString::release(&local_e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  return;
}

Assistant:

void test_dt_unsignedInt()
{
    const XSValue::DataType dt = XSValue::dt_unsignedInt;
    bool  toValidate = true;

    const char lex_v_ran_v_0[]="   1234   \n";

    const char lex_v_ran_v_1[]="+4294967295";
    const char lex_v_ran_v_2[]="0";
    const char lex_v_ran_iv_1[]="4294967296";
    const char lex_v_ran_iv_2[]="-1";

    XSValue::XSValue_Data act_v_ran_v_0;  act_v_ran_v_0.fValue.f_uint = (unsigned int)1234;
    XSValue::XSValue_Data act_v_ran_v_1;  act_v_ran_v_1.fValue.f_uint = (unsigned int)+4294967295;
    XSValue::XSValue_Data act_v_ran_v_2;  act_v_ran_v_2.fValue.f_uint = (unsigned int)0;

    const char lex_v_ran_v_1_canrep[]="4294967295";
    const char lex_v_ran_v_2_canrep[]="0";
    const char lex_v_ran_iv_1_canrep[]="4294967296";
    const char lex_v_ran_iv_2_canrep[]="-1";

    const char lex_iv_1[]="12b34.456";
    const char lex_iv_2[]="1234b56";

/***
 * 3.3.22.2 Canonical representation
 *
 * The canonical representation for unsignedInt is defined by prohibiting certain options from the
 * Lexical representation (3.3.22.1). Specifically,
 * leading zeroes are prohibited.
 *
 ***/

    const char data_rawstr_1[]="   +12345   \n";
    const char data_canrep_1[]="12345";
    const char data_rawstr_2[]="00012345";
    const char data_canrep_2[]="12345";

    /***
     *
     * validate
     * ---------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *    lexical valid
     *            range  valid                           true              n/a
     *            range  invalid                         false           st_FOCA0002
     *    lexical invalid                                false           st_FOCA0002
     *
     ***/

    // lexical valid, valid range
    VALIDATE_TEST(lex_v_ran_v_0  , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_v_1  , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_v_2  , dt, EXP_RET_VALID_TRUE, DONT_CARE);

    // lexical valid, invalid range
    VALIDATE_TEST(lex_v_ran_iv_1 , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(lex_v_ran_iv_2 , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);

    // lexical invalid
    VALIDATE_TEST(lex_iv_1         , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(lex_iv_2         , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);

    /***
     *
     * getActualValue
     * ---------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *  lexical valid
     *          range  valid                              XSValue         n/a
     *          range  invalid                              0            st_Unpresentable
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid
     *          range  valid                              XSValue         n/a
     *          range  invalid                              0            st_Unpresentable
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int i = 0; i < 2; i++)
    {
        //validation on/off
        toValidate = ( 0 == i) ? true : false;

        ACTVALUE_TEST(lex_v_ran_v_0,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_0);

        ACTVALUE_TEST(lex_v_ran_v_1,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_1);
        ACTVALUE_TEST(lex_v_ran_v_2,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_2);
        ACTVALUE_TEST(lex_v_ran_iv_1, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);
        ACTVALUE_TEST(lex_v_ran_iv_2, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);

        ACTVALUE_TEST(lex_iv_1,         dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);
        ACTVALUE_TEST(lex_iv_2,         dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);
    }

    /***
     *
     * getCanonicalRepresentation
     * ---------------------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *  lexical valid
     *          range  valid                              XMLCh          n/a
     *          range  invalid                              0            st_FOCA0002
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid
     *          range  valid                              XMLCh         n/a
     *          range  invalid                            XMLCh         n/a
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int j = 0; j < 2; j++)
    {
        //validation on/off
        toValidate = ( 0 == j)? true : false;

        CANREP_TEST(data_rawstr_1,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_1,    DONT_CARE);
        CANREP_TEST(data_rawstr_2,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_2,    XSValue::st_FOCA0002);

        CANREP_TEST(lex_v_ran_v_1,  dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran_v_1_canrep,  DONT_CARE);
        CANREP_TEST(lex_v_ran_v_2,  dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran_v_2_canrep,  DONT_CARE);

        CANREP_TEST(lex_iv_1        , dt, toValidate, EXP_RET_CANREP_FALSE, null_string,      XSValue::st_FOCA0002);
        CANREP_TEST(lex_iv_2        , dt, toValidate, EXP_RET_CANREP_FALSE, null_string,      XSValue::st_FOCA0002);

    }

    //validation on
    CANREP_TEST(lex_v_ran_iv_1, dt, true,  EXP_RET_CANREP_FALSE, null_string, XSValue::st_FOCA0002);
    CANREP_TEST(lex_v_ran_iv_2, dt, true,  EXP_RET_CANREP_FALSE, null_string, XSValue::st_FOCA0002);

    //validation off
    CANREP_TEST(lex_v_ran_iv_1, dt, false, EXP_RET_CANREP_TRUE,  lex_v_ran_iv_1_canrep, DONT_CARE);
    CANREP_TEST(lex_v_ran_iv_2, dt, false, EXP_RET_CANREP_TRUE,  lex_v_ran_iv_2_canrep, DONT_CARE);
}